

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_periodDisabled_TestShell::
~TEST_MemoryLeakDetectorTest_periodDisabled_TestShell
          (TEST_MemoryLeakDetectorTest_periodDisabled_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_periodDisabled_TestShell *this_local;
  
  ~TEST_MemoryLeakDetectorTest_periodDisabled_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, periodDisabled)
{
    detector->disable();
    char* mem = detector->allocMemory(defaultMallocAllocator(), 2);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_disabled));
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_enabled));
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_checking));
    detector->deallocMemory(defaultMallocAllocator(), mem);
}